

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayoutState::clear(QMainWindowLayoutState *this)

{
  long lVar1;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect *this_00;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int iStack_10;
  int iStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QToolBarAreaLayout::clear
            ((QToolBarAreaLayout *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  QDockAreaLayout::clear
            ((QDockAreaLayout *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  QRect::QRect(this_00);
  (in_RDI->x1).m_i = in_stack_ffffffffffffffe8;
  (in_RDI->y1).m_i = in_stack_ffffffffffffffec;
  (in_RDI->x2).m_i = iStack_10;
  (in_RDI->y2).m_i = iStack_c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::clear()
{
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.clear();
#endif

#if QT_CONFIG(dockwidget)
    dockAreaLayout.clear();
#else
    centralWidgetRect = QRect();
#endif

    rect = QRect();
}